

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_newmetatable(lua_State *L,char *tname)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCtab *t;
  size_t lenx;
  GCstr *key;
  TValue *pTVar3;
  GCtab *pGVar4;
  GCtab *mt;
  TValue *tv;
  GCtab *regt;
  char *tname_local;
  lua_State *L_local;
  GCobj *o;
  
  t = (GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff);
  lenx = strlen(tname);
  key = lj_str_new(L,tname,lenx);
  pTVar3 = lj_tab_setstr(L,t,key);
  if (pTVar3->u64 == 0xffffffffffffffff) {
    pGVar4 = lj_tab_new(L,0,1);
    pTVar3->u64 = (ulong)pGVar4 | 0xfffa000000000000;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->u64 = (ulong)pGVar4 | 0xfffa000000000000;
    if ((t->marked & 4) != 0) {
      uVar1 = (L->glref).ptr64;
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
      *(GCtab **)(uVar1 + 0x40) = t;
    }
    L_local._4_4_ = 1;
  }
  else {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    *pTVar2 = *pTVar3;
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_newmetatable(lua_State *L, const char *tname)
{
  GCtab *regt = tabV(registry(L));
  TValue *tv = lj_tab_setstr(L, regt, lj_str_newz(L, tname));
  if (tvisnil(tv)) {
    GCtab *mt = lj_tab_new(L, 0, 1);
    settabV(L, tv, mt);
    settabV(L, L->top++, mt);
    lj_gc_anybarriert(L, regt);
    return 1;
  } else {
    copyTV(L, L->top++, tv);
    return 0;
  }
}